

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBuildPrograms.cpp
# Opt level: O3

void __thiscall vkt::anon_unknown_0::TaskExecutor::~TaskExecutor(TaskExecutor *this)

{
  pointer pSVar1;
  Task *in_RAX;
  pointer pSVar2;
  ulong uVar3;
  long lVar4;
  Task *local_28;
  
  local_28 = in_RAX;
  if ((this->m_threads).
      super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_threads).
      super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      local_28 = (Task *)0x0;
      de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::pushFront
                (&this->m_tasks,&local_28);
      uVar3 = uVar3 + 1;
      pSVar2 = (this->m_threads).
               super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar1 = (this->m_threads).
               super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar3 < (ulong)((long)pSVar1 - (long)pSVar2 >> 4));
    if (pSVar1 != pSVar2) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        de::Thread::join(*(Thread **)((long)&pSVar2->m_ptr + lVar4));
        uVar3 = uVar3 + 1;
        pSVar2 = (this->m_threads).
                 super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x10;
      } while (uVar3 < (ulong)((long)(this->m_threads).
                                     super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4)
              );
    }
  }
  de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::~ThreadSafeRingBuffer
            (&this->m_tasks);
  std::
  vector<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
  ::~vector(&this->m_threads);
  return;
}

Assistant:

TaskExecutor::~TaskExecutor (void)
{
	for (size_t ndx = 0; ndx < m_threads.size(); ++ndx)
		m_tasks.pushFront(DE_NULL);

	for (size_t ndx = 0; ndx < m_threads.size(); ++ndx)
		m_threads[ndx]->join();
}